

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuplesContactN.h
# Opt level: O3

ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
* __thiscall
chrono::
ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
::Clone(ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
        *this)

{
  double dVar1;
  ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  *pCVar2;
  ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  *this_00;
  
  this_00 = (ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
             *)::operator_new(0xd8);
  ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  ::ChConstraintTwoTuples
            ((ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
              *)this_00,
             &this->
              super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
            );
  (this_00->
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  ).super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b12888;
  dVar1 = (this->super_ChConstraintTwoTuplesContactNall).cohesion;
  (this_00->super_ChConstraintTwoTuplesContactNall).friction =
       (this->super_ChConstraintTwoTuplesContactNall).friction;
  (this_00->super_ChConstraintTwoTuplesContactNall).cohesion = dVar1;
  pCVar2 = this->constraint_V;
  this_00->constraint_U = this->constraint_U;
  this_00->constraint_V = pCVar2;
  return this_00;
}

Assistant:

virtual ChConstraintTwoTuplesContactN* Clone() const override { return new ChConstraintTwoTuplesContactN(*this); }